

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_waitfds(CURLM *m,curl_waitfd *ufds,uint size,uint *fd_count)

{
  uint_bset *bset;
  _Bool _Var1;
  uint uVar2;
  Curl_easy *data;
  CURLMcode CVar3;
  int iVar4;
  uint mid;
  Curl_waitfds cwfds;
  easy_pollset ps;
  uint local_6c;
  uint *local_68;
  Curl_waitfds local_60;
  easy_pollset local_50;
  
  if ((((ufds != (curl_waitfd *)0x0) ||
       (CVar3 = CURLM_BAD_FUNCTION_ARGUMENT, fd_count != (uint *)0x0 && size == 0)) &&
      (CVar3 = CURLM_BAD_HANDLE, m != (CURLM *)0x0)) &&
     ((*m == 0xbab1e && (CVar3 = CURLM_RECURSIVE_API_CALL, (*(byte *)((long)m + 0x271) & 4) == 0))))
  {
    local_68 = fd_count;
    Curl_waitfds_init(&local_60,ufds,size);
    bset = (uint_bset *)((long)m + 0x28);
    _Var1 = Curl_uint_bset_first(bset,&local_6c);
    iVar4 = 0;
    if (_Var1) {
      iVar4 = 0;
      do {
        data = Curl_multi_get_easy((Curl_multi *)m,local_6c);
        if (data == (Curl_easy *)0x0) {
          Curl_uint_bset_remove(bset,local_6c);
        }
        else {
          Curl_multi_getsock(data,&local_50,"curl_multi_waitfds");
          uVar2 = Curl_waitfds_add_ps(&local_60,&local_50);
          iVar4 = iVar4 + uVar2;
        }
        _Var1 = Curl_uint_bset_next(bset,local_6c,&local_6c);
      } while (_Var1);
    }
    uVar2 = Curl_cshutdn_add_waitfds
                      ((cshutdn *)((long)m + 0x188),*(Curl_easy **)((long)m + 0x78),&local_60);
    CVar3 = CURLM_OK;
    if (ufds != (curl_waitfd *)0x0) {
      CVar3 = (uint)(uVar2 + iVar4 != local_60.n) * 3;
    }
    if (local_68 != (uint *)0x0) {
      *local_68 = uVar2 + iVar4;
    }
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_waitfds(CURLM *m,
                             struct curl_waitfd *ufds,
                             unsigned int size,
                             unsigned int *fd_count)
{
  struct Curl_waitfds cwfds;
  CURLMcode result = CURLM_OK;
  struct Curl_multi *multi = m;
  unsigned int need = 0, mid;

  if(!ufds && (size || !fd_count))
    return CURLM_BAD_FUNCTION_ARGUMENT;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  Curl_waitfds_init(&cwfds, ufds, size);
  if(Curl_uint_bset_first(&multi->process, &mid)) {
    do {
      struct Curl_easy *data = Curl_multi_get_easy(multi, mid);
      struct easy_pollset ps;
      if(!data) {
        DEBUGASSERT(0);
        Curl_uint_bset_remove(&multi->process, mid);
        continue;
      }
      Curl_multi_getsock(data, &ps, "curl_multi_waitfds");
      need += Curl_waitfds_add_ps(&cwfds, &ps);
    }
    while(Curl_uint_bset_next(&multi->process, mid, &mid));
  }

  need += Curl_cshutdn_add_waitfds(&multi->cshutdn, multi->admin, &cwfds);

  if(need != cwfds.n && ufds) {
    result = CURLM_OUT_OF_MEMORY;
  }

  if(fd_count)
    *fd_count = need;
  return result;
}